

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>::
reserve(vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_> *this
       ,size_t n)

{
  Bounds2<float> *pBVar1;
  iterator pBVar2;
  ulong in_RSI;
  vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_> *in_RDI;
  int i;
  Bounds2<float> *ra;
  Bounds2<float> *in_stack_ffffffffffffffc8;
  Bounds2<float> *in_stack_ffffffffffffffd0;
  int local_1c;
  
  if (in_RDI->nAlloc < in_RSI) {
    pBVar1 = pmr::polymorphic_allocator<pbrt::Bounds2<float>>::allocate_object<pbrt::Bounds2<float>>
                       ((polymorphic_allocator<pbrt::Bounds2<float>_> *)in_stack_ffffffffffffffd0,
                        (size_t)in_stack_ffffffffffffffc8);
    for (local_1c = 0; (ulong)(long)local_1c < in_RDI->nStored; local_1c = local_1c + 1) {
      in_stack_ffffffffffffffd0 = pBVar1 + local_1c;
      pBVar2 = begin(in_RDI);
      pmr::polymorphic_allocator<pbrt::Bounds2<float>>::
      construct<pbrt::Bounds2<float>,pbrt::Bounds2<float>>
                ((polymorphic_allocator<pbrt::Bounds2<float>> *)in_RDI,in_stack_ffffffffffffffd0,
                 pBVar2 + local_1c);
      pBVar2 = begin(in_RDI);
      pmr::polymorphic_allocator<pbrt::Bounds2<float>>::destroy<pbrt::Bounds2<float>>
                ((polymorphic_allocator<pbrt::Bounds2<float>> *)in_RDI,pBVar2 + local_1c);
    }
    pmr::polymorphic_allocator<pbrt::Bounds2<float>>::deallocate_object<pbrt::Bounds2<float>>
              ((polymorphic_allocator<pbrt::Bounds2<float>_> *)in_stack_ffffffffffffffd0,
               in_stack_ffffffffffffffc8,0x6cdc94);
    in_RDI->nAlloc = in_RSI;
    in_RDI->ptr = pBVar1;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }